

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void modifyDeepChannels<float>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
               *channels,float delta)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  reference this;
  long lVar4;
  uint *puVar5;
  float **ppfVar6;
  Array2D<unsigned_int> *in_RDI;
  float in_XMM0_Da;
  uint32_t j;
  uint32_t count;
  int x;
  int y;
  Array2D<float_*> *channel;
  iterator i;
  list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
  *in_stack_ffffffffffffff98;
  uint local_40;
  int local_38;
  int local_34;
  _Self local_28;
  _Self local_20;
  float local_14;
  Array2D<unsigned_int> *local_8;
  
  local_14 = in_XMM0_Da;
  local_8 = in_RDI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>::
       begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar3 = std::operator!=(&local_20,&local_28);
    if (!bVar3) break;
    this = std::_List_iterator<Imf_3_4::Array2D<float_*>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<float_*>_> *)0x11a704);
    local_34 = 0;
    while( true ) {
      lVar4 = Imf_3_4::Array2D<float_*>::height(this);
      if (lVar4 <= local_34) break;
      local_38 = 0;
      while( true ) {
        lVar4 = Imf_3_4::Array2D<float_*>::width(this);
        if (lVar4 <= local_38) break;
        puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](local_8,(long)local_34);
        uVar1 = puVar5[local_38];
        for (local_40 = 0; fVar2 = local_14, local_40 < uVar1; local_40 = local_40 + 1) {
          ppfVar6 = Imf_3_4::Array2D<float_*>::operator[](this,(long)local_34);
          ppfVar6[local_38][local_40] = fVar2 + ppfVar6[local_38][local_40];
        }
        local_38 = local_38 + 1;
      }
      local_34 = local_34 + 1;
    }
    std::_List_iterator<Imf_3_4::Array2D<float_*>_>::operator++(&local_20,0);
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}